

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

void * push_ds(flatcc_builder_t *B,flatbuffers_uoffset_t size)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = B->ds_offset;
  uVar3 = size + uVar1;
  B->ds_offset = uVar3;
  if ((B->ds_limit <= uVar3) && (iVar2 = reserve_ds(B,(ulong)(uVar3 + 1),0xfffffffc), iVar2 != 0)) {
    return (void *)0x0;
  }
  return B->ds + uVar1;
}

Assistant:

static inline void *push_ds(flatcc_builder_t *B, uoffset_t size)
{
    size_t offset;

    offset = B->ds_offset;
    if ((B->ds_offset += size) >= B->ds_limit) {
        if (reserve_ds(B, B->ds_offset + 1, data_limit)) {
            return 0;
        }
    }
    return B->ds + offset;
}